

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseEditionsTest_MapFeatures_Test::
~ParseEditionsTest_MapFeatures_Test(ParseEditionsTest_MapFeatures_Test *this)

{
  ParserTest::~ParserTest(&this->super_ParseEditionsTest);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParseEditionsTest, MapFeatures) {
  ExpectParsesTo(
      R"schema(
        edition = '2023';
        message Foo {
          map<string, int> map_field = 1 [
            features.my_feature = SOMETHING
          ];
        })schema",
      R"pb(message_type {
             name: "Foo"
             field {
               name: "map_field"
               number: 1
               label: LABEL_REPEATED
               type_name: "MapFieldEntry"
               options {
                 uninterpreted_option {
                   name { name_part: "features" is_extension: false }
                   name { name_part: "my_feature" is_extension: false }
                   identifier_value: "SOMETHING"
                 }
               }
             }
             nested_type {
               name: "MapFieldEntry"
               field {
                 name: "key"
                 number: 1
                 label: LABEL_OPTIONAL
                 type: TYPE_STRING
                 options {
                   uninterpreted_option {
                     name { name_part: "features" is_extension: false }
                     name { name_part: "my_feature" is_extension: false }
                     identifier_value: "SOMETHING"
                   }
                 }
               }
               field {
                 name: "value"
                 number: 2
                 label: LABEL_OPTIONAL
                 type_name: "int"
                 options {
                   uninterpreted_option {
                     name { name_part: "features" is_extension: false }
                     name { name_part: "my_feature" is_extension: false }
                     identifier_value: "SOMETHING"
                   }
                 }
               }
               options { map_entry: true }
             }
           }
           syntax: "editions"
           edition: EDITION_2023)pb");
}